

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O1

void __thiscall mp::SPAdapter::ExtractRandomTerms(SPAdapter *this)

{
  SparseMatrix<double> *pSVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int *piVar5;
  pointer pRVar6;
  ColProblem *pCVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer piVar12;
  pointer pdVar13;
  pointer pBVar14;
  byte bVar15;
  SPAdapter *pSVar16;
  int iVar17;
  pointer pRVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ExprBase e;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  size_type __new_size;
  pointer piVar27;
  VariableCollector collector;
  SparseMatrix<double_*> var2con;
  allocator_type local_101;
  SPAdapter *local_100;
  pointer local_f8;
  ColProblem *local_f0;
  pointer local_e8;
  BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
  local_e0;
  undefined4 local_d8;
  SPAdapter *local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined8 local_b0;
  SparseMatrix<double> *local_a8;
  vector<bool,_std::allocator<bool>_> local_a0;
  SparseMatrix<double_*> local_78;
  
  piVar5 = (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar22 = (long)*piVar5;
  uVar21 = piVar5[1];
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->linear_random_).starts_,(long)(int)uVar21 + 1);
  pRVar18 = (this->random_vars_).
            super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (this->random_vars_).
           super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar18 != pRVar6) {
    pCVar7 = this->problem_;
    piVar27 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (pCVar7->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar26 = piVar8[pRVar18->var_index];
      iVar17 = piVar8[(long)pRVar18->var_index + 1];
      if (iVar17 != iVar26) {
        piVar10 = (pCVar7->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar23 = 0;
        do {
          piVar5 = piVar27 + (piVar9[piVar10[iVar26 + lVar23]] - lVar22) + 1;
          *piVar5 = *piVar5 + 1;
          lVar23 = lVar23 + 1;
        } while (iVar17 - iVar26 != (int)lVar23);
      }
      pRVar18 = pRVar18 + 1;
    } while (pRVar18 != pRVar6);
  }
  iVar26 = 0;
  if ((int)uVar21 < 1) {
    __new_size = 0;
  }
  else {
    piVar27 = (this->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar23 = 1;
    do {
      __new_size = (long)piVar27[lVar23] + (long)iVar26;
      piVar27[lVar23] = iVar26;
      lVar23 = lVar23 + 1;
      iVar26 = (int)__new_size;
    } while ((ulong)uVar21 + 1 != lVar23);
  }
  local_100 = this;
  std::vector<int,_std::allocator<int>_>::resize(&(this->linear_random_).indices_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->linear_random_).values_,__new_size);
  pSVar16 = local_100;
  pRVar18 = (this->random_vars_).
            super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (this->random_vars_).
           super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar18 != pRVar6) {
    pCVar7 = local_100->problem_;
    piVar27 = (local_100->linear_random_).starts_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar8 = (pCVar7->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (local_100->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (local_100->linear_random_).indices_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar11 = (local_100->linear_random_).values_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      iVar26 = piVar8[pRVar18->var_index];
      iVar17 = piVar8[(long)pRVar18->var_index + 1];
      if (iVar17 != iVar26) {
        piVar12 = (pCVar7->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = (pCVar7->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar23 = 0;
        do {
          lVar25 = piVar9[piVar12[iVar26 + lVar23]] - lVar22;
          iVar4 = piVar27[lVar25 + 1];
          piVar27[lVar25 + 1] = iVar4 + 1;
          piVar10[iVar4] = pRVar18->var_index;
          pdVar11[iVar4] = -pdVar13[iVar26 + lVar23];
          lVar23 = lVar23 + 1;
        } while (iVar17 - iVar26 != (int)lVar23);
      }
      pRVar18 = pRVar18 + 1;
    } while (pRVar18 != pRVar6);
  }
  pSVar1 = &local_100->vars_in_nonlinear_;
  local_d8 = 0;
  local_d0 = local_100;
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicRandomAffineExprExtractor_0019b778;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,
             (long)(int)((ulong)((long)(local_100->var_core2orig_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(local_100->var_core2orig_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2),
             (allocator_type *)&local_78);
  local_b0 = 0x3ff0000000000000;
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__VariableCollector_0019b6e8;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_f0 = (ColProblem *)pSVar1;
  local_a8 = pSVar1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a0,
             (long)(int)((ulong)((long)(pSVar16->var_core2orig_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pSVar16->var_core2orig_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2),(bool *)&local_78,
             &local_101);
  local_f8 = (pSVar16->problem_->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
  piVar5 = (local_d0->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar26 = *piVar5;
  iVar17 = piVar5[1];
  std::vector<int,_std::allocator<int>_>::resize(&local_a8->starts_,(long)iVar17 + 1);
  if (0 < iVar17) {
    piVar27 = (pointer)0x0;
    local_e8 = (pointer)(long)iVar17;
    do {
      uVar19 = (ulong)(local_d0->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)piVar27 + (long)iVar26];
      pBVar14 = (local_d0->problem_->super_Problem).nonlinear_cons_.
                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (uVar19 < (ulong)((long)(local_d0->problem_->super_Problem).nonlinear_cons_.
                                 super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar14 >> 3)) {
        e.impl_ = pBVar14[uVar19].super_ExprBase.impl_;
      }
      else {
        e.impl_ = (Impl *)0x0;
      }
      if (e.impl_ != (Impl *)0x0) {
        BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
        ::Visit(&local_e0,(Expr)e.impl_);
      }
      pSVar1 = local_a8;
      iVar17 = (int)((ulong)((long)(local_a8->indices_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(local_a8->indices_).super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      (local_a8->starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(long)piVar27 + 1] = iVar17;
      std::vector<int,_std::allocator<int>_>::resize(&local_a8->indices_,(long)iVar17);
      std::vector<double,_std::allocator<double>_>::resize(&pSVar1->values_,(long)iVar17);
      piVar8 = (local_a8->starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = piVar8[(long)piVar27];
      lVar23 = (long)iVar17;
      piVar27 = (pointer)((long)piVar27 + 1);
      iVar4 = piVar8[(long)piVar27];
      if (iVar17 < iVar4) {
        piVar8 = (local_a8->indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar11 = (local_a8->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar17 = piVar8[lVar23];
          uVar20 = (ulong)iVar17;
          pdVar11[lVar23] =
               local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar20] = 0.0;
          uVar19 = uVar20 + 0x3f;
          if (-1 < (long)uVar20) {
            uVar19 = uVar20;
          }
          bVar15 = (byte)iVar17 & 0x3f;
          local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar19 >> 6) + ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar19 >> 6) +
                  ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
                 (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
          lVar23 = lVar23 + 1;
        } while (iVar4 != lVar23);
      }
    } while (piVar27 != local_e8);
  }
  pSVar16 = local_100;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar21 = (uint)((ulong)((long)(local_100->var_core2orig_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(local_100->var_core2orig_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  internal::Transpose((SparseMatrix<double> *)local_f0,&local_78,uVar21);
  pCVar7 = pSVar16->problem_;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&pSVar16->core_coefs_,local_f8,
             local_f8 +
             (pCVar7->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start
             [(int)((ulong)((long)(pCVar7->super_Problem).vars_.
                                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pCVar7->super_Problem).vars_.
                                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)]);
  if (0 < (int)uVar21) {
    local_e8 = (pSVar16->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_f0 = pSVar16->problem_;
    pdVar11 = (pSVar16->core_coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_f8 = (pointer)(local_f0->col_starts_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    piVar27 = (pSVar16->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      lVar23 = (long)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19];
      iVar26 = local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19 + 1];
      if (local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] < iVar26) {
        piVar8 = (local_f0->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = *(int *)((long)local_f8 + (long)local_e8[uVar19] * 4);
        do {
          lVar25 = 0;
          do {
            lVar24 = lVar25;
            lVar25 = lVar24 + 1;
          } while (piVar8[iVar17 + lVar24] !=
                   piVar27[local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar23] + lVar22]);
          dVar2 = pdVar11[iVar17 + lVar24];
          dVar3 = *local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar23];
          *local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar23] = dVar2;
          pdVar11[iVar17 + lVar24] = dVar3 + dVar2;
          lVar23 = lVar23 + 1;
          iVar17 = iVar17 + (int)(lVar24 + 1) + -1;
        } while (lVar23 != iVar26);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uVar21 & 0x7fffffff));
  }
  if (local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.values_.super__Vector_base<double_*,_std::allocator<double_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__VariableCollector_0019b6e8;
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  local_e0._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicRandomAffineExprExtractor_0019b778;
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPAdapter::ExtractRandomTerms() {
  int num_stage1_cons = num_stage_cons_[0];
  int num_stage2_cons = num_stage_cons_[1];

  // A matrix containing linear terms involving random variables.
  // The major dimension is equal to the number of second-stage constraints.
  linear_random_.resize_major(num_stage2_cons);

  // Count random variables in second-stage constraints.
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       ++linear_random_.start(core_con_index - num_stage1_cons + 1);
    }
  }
  // Acummulate counts to get vector starts.
  int start = 0;
  for (int i = 1; i <= num_stage2_cons; ++i) {
    int next = start + linear_random_.start(i);
    linear_random_.start(i) = start;
    start = next;
  }

  // Map second-stage constraints to random variables that appear linearly
  // in them.
  linear_random_.resize_elements(start);
  for (auto i = random_vars_.begin(), end = random_vars_.end(); i != end; ++i) {
    for (int k = problem_.col_start(i->var_index),
         end = problem_.col_start(i->var_index + 1); k != end; ++k) {
       int core_con_index = con_orig2core_[problem_.row_index(k)];
       assert(core_con_index >= num_stage1_cons);
       int index = core_con_index - num_stage1_cons + 1;
       int element_index = linear_random_.start(index)++;
       linear_random_.index(element_index) = i->var_index;
       linear_random_.value(element_index) = -problem_.value(k);
    }
  }

  // Get variables that appear in nonlinear parts of constraint expressions.
  VariableCollector collector(*this, vars_in_nonlinear_);
  const double *coefs = problem_.values();
  collector.Collect();

  // Convert vars_in_nonlinear_ to column-major form.
  int num_vars = this->num_vars();
  SparseMatrix<double*> var2con;
  internal::Transpose(vars_in_nonlinear_, var2con, num_vars);

  // Combine the first scenario with core coefficients.
  core_coefs_.assign(coefs, coefs + problem_.col_start(problem_.num_vars()));
  for (int core_var_index = 0; core_var_index < num_vars; ++core_var_index) {
    int var_index = var_core2orig_[core_var_index];
    int elt_index = problem_.col_start(var_index);
    for (int j = var2con.start(core_var_index),
         n = var2con.start(core_var_index + 1); j < n; ++j) {
      int con_index = con_core2orig_[var2con.index(j) + num_stage1_cons];
      while (problem_.row_index(elt_index) != con_index)
        ++elt_index;
      assert(elt_index < problem_.col_start(var_index + 1));
      double coef = core_coefs_[elt_index] + *var2con.value(j);
      *var2con.value(j) = core_coefs_[elt_index];
      core_coefs_[elt_index] = coef;
    }
  }
}